

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# q6.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_type sVar1;
  reference pvVar2;
  ostream *poVar3;
  undefined1 local_80 [8];
  string compressed;
  undefined1 local_50 [8];
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char **argv_local;
  int argc_local;
  
  get_args_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&str.field_2 + 8),argc,argv);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&str.field_2 + 8));
  if (sVar1 == 2) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&str.field_2 + 8),1);
    std::__cxx11::string::string((string *)local_50,(string *)pvVar2);
    compress_string((string *)local_80,(string *)local_50);
    poVar3 = std::operator<<((ostream *)&std::cout,"compressing ");
    poVar3 = std::operator<<(poVar3,(string *)local_50);
    poVar3 = std::operator<<(poVar3," as ");
    poVar3 = std::operator<<(poVar3,(string *)local_80);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)local_50);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&str.field_2 + 8));
  return 0;
}

Assistant:

int main(int argc, char** argv){
  auto args {get_args(argc, argv)};

  if (args.size() == 2){
    std::string str {args[1]};

    auto compressed {compress_string(str)};

    std::cout << "compressing " << str << " as " << compressed << '\n';
  }

  return 0;
}